

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepscheduler_kba.c
# Opt level: O1

int StepScheduler_nstep(StepScheduler *stepscheduler)

{
  int iVar1;
  int iVar2;
  
  switch(stepscheduler->nblock_octant_) {
  case 1:
    iVar1 = stepscheduler->nblock_z_;
    iVar2 = stepscheduler->nproc_y_;
    break;
  case 2:
    iVar2 = stepscheduler->nproc_y_;
    iVar1 = stepscheduler->nblock_z_ * 2;
    break;
  default:
    __assert_fail("Bool_false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/stepscheduler_kba.c"
                  ,0x6f,"int StepScheduler_nstep(const StepScheduler *)");
  case 4:
    return stepscheduler->nblock_z_ * 4 + stepscheduler->nproc_x_ + stepscheduler->nproc_y_ * 2 + -3
    ;
  case 8:
    return stepscheduler->nproc_x_ * 2 + stepscheduler->nblock_z_ * 8 + stepscheduler->nproc_y_ * 3
           + -5;
  }
  return iVar1 + stepscheduler->nproc_x_ + iVar2 + -2;
}

Assistant:

int StepScheduler_nstep( const StepScheduler* stepscheduler )
{
  int result;

  switch( stepscheduler->nblock_octant_ )
  {
    case 8:
      result = 8 * StepScheduler_nblock( stepscheduler )
                                        + 2 * ( stepscheduler->nproc_x_ - 1 )
                                        + 3 * ( stepscheduler->nproc_y_ - 1 );
      break;

    case 4:
      result = 4 * StepScheduler_nblock( stepscheduler )
                                        + 1 * ( stepscheduler->nproc_x_ - 1 )
                                        + 2 * ( stepscheduler->nproc_y_ - 1 );
      break;

    case 2:
      result = 2 * StepScheduler_nblock( stepscheduler )
                                        + 1 * ( stepscheduler->nproc_x_ - 1 )
                                        + 1 * ( stepscheduler->nproc_y_ - 1 );
      break;

    case 1:
      result = 1 * StepScheduler_nblock( stepscheduler )
                                        + 1 * ( stepscheduler->nproc_x_ - 1 )
                                        + 1 * ( stepscheduler->nproc_y_ - 1 );
      break;

    default:
      Assert( Bool_false );
      break;
  }

  return result;
}